

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapeprism.cpp
# Opt level: O3

void pzshape::TPZShapePrism::TransformDerivativeFromRibToPrisma
               (int rib,int num,TPZFMatrix<double> *dphi)

{
  long lVar1;
  long lVar2;
  double *pdVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  
  if (0 < num) {
    lVar4 = (long)rib;
    lVar1 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    uVar6 = 0;
    do {
      lVar2 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
      if (lVar2 <= (long)uVar6 || lVar1 < 1) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pdVar3 = dphi->fElem;
      lVar5 = lVar1 * uVar6;
      if ((lVar1 < 3) || (lVar2 <= (long)uVar6)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pdVar3[lVar5 + 2] = (double)(&DAT_01a30640)[lVar4 * 3] * pdVar3[lVar5];
      lVar2 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
      if (lVar2 <= (long)uVar6 || lVar1 < 1) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((lVar1 < 2) || (lVar2 <= (long)uVar6)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pdVar3[lVar1 * uVar6 + 1] = (double)(&DAT_01a30638)[lVar4 * 3] * pdVar3[lVar5];
      lVar2 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
      if (lVar2 <= (long)uVar6 || lVar1 < 1) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((lVar1 < 1) || (lVar2 <= (long)uVar6)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pdVar3[lVar1 * uVar6] = (double)(&gRibTrans3dPrisma1d)[lVar4 * 3] * pdVar3[lVar1 * uVar6];
      uVar6 = uVar6 + 1;
    } while ((uint)num != uVar6);
  }
  return;
}

Assistant:

void TPZShapePrism::TransformDerivativeFromRibToPrisma(int rib,int num,TPZFMatrix<REAL> &dphi) {
		for (int j = 0;j<num;j++) {
			dphi(2,j) = gRibTrans3dPrisma1d[rib][2]*dphi(0,j);
			dphi(1,j) = gRibTrans3dPrisma1d[rib][1]*dphi(0,j);
			dphi(0,j) = gRibTrans3dPrisma1d[rib][0]*dphi(0,j);
		}
	}